

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O1

bool google::protobuf::
     InsertIfNotPresent<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
               (unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                *collection,first_type *key,second_type *value)

{
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  __buckets_ptr pp_Var4;
  __node_ptr p_Var5;
  _Hash_node_base *p_Var6;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var7;
  ulong uVar8;
  size_type __n;
  ulong uVar9;
  _Hash_node_base _Var10;
  _Hash_node_base *p_Var11;
  pointer __ptr_1;
  undefined1 auVar12 [16];
  __buckets_alloc_type __alloc;
  new_allocator<std::__detail::_Hash_node_base_*> local_51;
  size_t local_50;
  undefined1 local_48 [16];
  second_type local_38;
  
  local_48._0_8_ = key->first;
  local_48._8_8_ = *(undefined8 *)&key->second;
  local_38 = *value;
  p_Var11 = (_Hash_node_base *)((long)(int)local_48._8_4_ * 0x1000193 ^ local_48._0_8_ * 0x100011b);
  uVar8 = (ulong)p_Var11 % (collection->_M_h)._M_bucket_count;
  p_Var5 = std::
           _Hashtable<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&collection->_M_h,uVar8,(key_type *)local_48,(__hash_code)p_Var11);
  if (p_Var5 == (__node_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)operator_new(0x28);
    p_Var6->_M_nxt = (_Hash_node_base *)0x0;
    p_Var6[1]._M_nxt = (_Hash_node_base *)local_48._0_8_;
    p_Var6[2]._M_nxt = (_Hash_node_base *)local_48._8_8_;
    p_Var6[3]._M_nxt = (_Hash_node_base *)local_38;
    local_50 = (collection->_M_h)._M_rehash_policy._M_next_resize;
    auVar12 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(collection->_M_h)._M_rehash_policy,
                         (collection->_M_h)._M_bucket_count,(collection->_M_h)._M_element_count);
    __n = auVar12._8_8_;
    if ((auVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = &(collection->_M_h)._M_single_bucket;
        (collection->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        (&local_51,__n,(void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var10._M_nxt = (collection->_M_h)._M_before_begin._M_nxt;
      (collection->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var10._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(collection->_M_h)._M_before_begin;
        uVar8 = 0;
        do {
          p_Var3 = (_Var10._M_nxt)->_M_nxt;
          uVar9 = (ulong)_Var10._M_nxt[4]._M_nxt % __n;
          if (__s[uVar9] == (_Hash_node_base *)0x0) {
            (_Var10._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var10._M_nxt;
            __s[uVar9] = p_Var1;
            if ((_Var10._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var7 = __s + uVar8;
              goto LAB_002c7df6;
            }
          }
          else {
            (_Var10._M_nxt)->_M_nxt = __s[uVar9]->_M_nxt;
            pp_Var7 = &__s[uVar9]->_M_nxt;
            uVar9 = uVar8;
LAB_002c7df6:
            *pp_Var7 = _Var10._M_nxt;
          }
          _Var10._M_nxt = p_Var3;
          uVar8 = uVar9;
        } while (p_Var3 != (_Hash_node_base *)0x0);
      }
      pp_Var4 = (collection->_M_h)._M_buckets;
      if (&(collection->_M_h)._M_single_bucket != pp_Var4) {
        operator_delete(pp_Var4);
      }
      (collection->_M_h)._M_bucket_count = __n;
      (collection->_M_h)._M_buckets = __s;
      uVar8 = (ulong)p_Var11 % __n;
    }
    p_Var6[4]._M_nxt = p_Var11;
    pp_Var4 = (collection->_M_h)._M_buckets;
    if (pp_Var4[uVar8] == (__node_base_ptr)0x0) {
      p_Var11 = (collection->_M_h)._M_before_begin._M_nxt;
      p_Var6->_M_nxt = p_Var11;
      (collection->_M_h)._M_before_begin._M_nxt = p_Var6;
      if (p_Var11 != (_Hash_node_base *)0x0) {
        pp_Var4[(ulong)p_Var11[4]._M_nxt % (collection->_M_h)._M_bucket_count] = p_Var6;
      }
      (collection->_M_h)._M_buckets[uVar8] = &(collection->_M_h)._M_before_begin;
    }
    else {
      p_Var6->_M_nxt = pp_Var4[uVar8]->_M_nxt;
      pp_Var4[uVar8]->_M_nxt = p_Var6;
    }
    psVar2 = &(collection->_M_h)._M_element_count;
    *psVar2 = *psVar2 + 1;
  }
  return p_Var5 == (__node_ptr)0x0;
}

Assistant:

bool InsertIfNotPresent(
    Collection* const collection,
    const typename Collection::value_type::first_type& key,
    const typename Collection::value_type::second_type& value) {
  return InsertIfNotPresent(
      collection, typename Collection::value_type(key, value));
}